

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_8.c
# Opt level: O0

parasail_result_t *
parasail_sw_rowcol_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  char cVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  __m256i a;
  __m256i alVar12;
  __m256i c;
  __m256i vH_00;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  __m256i *palVar20;
  int iVar21;
  int iVar22;
  __m256i *ptr;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  int32_t temp;
  int32_t column_len;
  int8_t *t;
  __m256i *pv_2;
  __m256i *pv_1;
  __m256i vH_1;
  __m256i vCompare;
  __m256i *pv;
  __m256i *vP;
  __m256i vH;
  __m256i vF;
  __m256i vE;
  parasail_result_t *result;
  __m256i insert_mask;
  int8_t maxp;
  __m256i vMaxHUnit;
  __m256i vMaxH;
  __m256i vBias;
  int8_t score;
  int8_t bias;
  __m256i vZero;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvE;
  __m256i *pvHMax;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  undefined1 in_stack_fffffffffffff560 [12];
  int32_t in_stack_fffffffffffff56c;
  int32_t in_stack_fffffffffffff570;
  int32_t in_stack_fffffffffffff574;
  undefined4 in_stack_fffffffffffff578;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined4 in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff584;
  undefined8 in_stack_fffffffffffff588;
  __m256i *palVar28;
  longlong in_stack_fffffffffffff590;
  __m256i *in_stack_fffffffffffff5b0;
  long lStack_a28;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  longlong local_9c0;
  longlong lStack_9b8;
  longlong lStack_9b0;
  longlong lStack_9a8;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined1 local_920 [32];
  byte local_8c2;
  __m256i *local_840;
  __m256i *local_838;
  __m256i *local_830;
  int local_800;
  int local_7fc;
  int local_7f8;
  int local_7f4;
  int local_7f0;
  byte local_7ec;
  byte local_7e8;
  parasail_result_t *local_7d0;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_rowcol_striped_profile_avx2_256_8","profile");
    local_7d0 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x18) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_rowcol_striped_profile_avx2_256_8",
            "profile->profile8.score");
    local_7d0 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_rowcol_striped_profile_avx2_256_8",
            "profile->matrix");
    local_7d0 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_rowcol_striped_profile_avx2_256_8",
            "profile->s1Len");
    local_7d0 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_rowcol_striped_profile_avx2_256_8","s2");
    local_7d0 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_rowcol_striped_profile_avx2_256_8","s2Len");
    local_7d0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_rowcol_striped_profile_avx2_256_8","open");
    local_7d0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_rowcol_striped_profile_avx2_256_8","gap");
    local_7d0 = (parasail_result_t *)0x0;
  }
  else {
    local_800 = 0;
    local_7fc = *(int *)(in_RDI + 8);
    lVar2 = *(long *)(in_RDI + 0x10);
    iVar21 = (local_7fc + 0x1f) / 0x20;
    lVar3 = *(long *)(in_RDI + 0x18);
    local_7e8 = (byte)in_ECX;
    auVar4 = vpinsrb_avx(ZEXT116(local_7e8),in_ECX & 0xff,1);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,2);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,3);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,4);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,5);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,6);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,7);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,8);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,9);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,10);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,0xb);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,0xc);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,0xd);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,0xe);
    auVar4 = vpinsrb_avx(auVar4,in_ECX & 0xff,0xf);
    auVar5 = vpinsrb_avx(ZEXT116(local_7e8),in_ECX & 0xff,1);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,2);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,3);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,4);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,5);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,6);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,7);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,8);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,9);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,10);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,0xb);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,0xc);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,0xd);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,0xe);
    auVar5 = vpinsrb_avx(auVar5,in_ECX & 0xff,0xf);
    uStack_6f0 = auVar5._0_8_;
    uStack_6e8 = auVar5._8_8_;
    local_7ec = (byte)in_R8D;
    auVar5 = vpinsrb_avx(ZEXT116(local_7ec),in_R8D & 0xff,1);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,2);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,3);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,4);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,5);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,6);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,7);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,8);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,9);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,10);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,0xb);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,0xc);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,0xd);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,0xe);
    auVar5 = vpinsrb_avx(auVar5,in_R8D & 0xff,0xf);
    auVar23 = vpinsrb_avx(ZEXT116(local_7ec),in_R8D & 0xff,1);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,2);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,3);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,4);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,5);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,6);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,7);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,8);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,9);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,10);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,0xb);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,0xc);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,0xd);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,0xe);
    auVar23 = vpinsrb_avx(auVar23,in_R8D & 0xff,0xf);
    uStack_6b0 = auVar23._0_8_;
    uStack_6a8 = auVar23._8_8_;
    uVar26 = 0;
    auVar23 = vpinsrb_avx(ZEXT116(0),0,1);
    auVar23 = vpinsrb_avx(auVar23,0,2);
    auVar23 = vpinsrb_avx(auVar23,0,3);
    auVar23 = vpinsrb_avx(auVar23,0,4);
    auVar23 = vpinsrb_avx(auVar23,0,5);
    auVar23 = vpinsrb_avx(auVar23,0,6);
    auVar23 = vpinsrb_avx(auVar23,0,7);
    auVar23 = vpinsrb_avx(auVar23,0,8);
    auVar23 = vpinsrb_avx(auVar23,0,9);
    auVar23 = vpinsrb_avx(auVar23,0,10);
    auVar23 = vpinsrb_avx(auVar23,0,0xb);
    auVar23 = vpinsrb_avx(auVar23,0,0xc);
    auVar23 = vpinsrb_avx(auVar23,0,0xd);
    auVar23 = vpinsrb_avx(auVar23,0,0xe);
    auVar23 = vpinsrb_avx(auVar23,0,0xf);
    auVar6 = vpinsrb_avx(ZEXT116(0),0,1);
    auVar6 = vpinsrb_avx(auVar6,0,2);
    auVar6 = vpinsrb_avx(auVar6,0,3);
    auVar6 = vpinsrb_avx(auVar6,0,4);
    auVar6 = vpinsrb_avx(auVar6,0,5);
    auVar6 = vpinsrb_avx(auVar6,0,6);
    auVar6 = vpinsrb_avx(auVar6,0,7);
    auVar6 = vpinsrb_avx(auVar6,0,8);
    auVar6 = vpinsrb_avx(auVar6,0,9);
    auVar6 = vpinsrb_avx(auVar6,0,10);
    auVar6 = vpinsrb_avx(auVar6,0,0xb);
    auVar6 = vpinsrb_avx(auVar6,0,0xc);
    auVar6 = vpinsrb_avx(auVar6,0,0xd);
    auVar6 = vpinsrb_avx(auVar6,0,0xe);
    auVar6 = vpinsrb_avx(auVar6,0,0xf);
    uStack_670 = auVar6._0_8_;
    uStack_668 = auVar6._8_8_;
    local_8c2 = 0x80;
    uVar27 = 0x80;
    auVar6 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar6 = vpinsrb_avx(auVar6,0x80,2);
    auVar6 = vpinsrb_avx(auVar6,0x80,3);
    auVar6 = vpinsrb_avx(auVar6,0x80,4);
    auVar6 = vpinsrb_avx(auVar6,0x80,5);
    auVar6 = vpinsrb_avx(auVar6,0x80,6);
    auVar6 = vpinsrb_avx(auVar6,0x80,7);
    auVar6 = vpinsrb_avx(auVar6,0x80,8);
    auVar6 = vpinsrb_avx(auVar6,0x80,9);
    auVar6 = vpinsrb_avx(auVar6,0x80,10);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xb);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xc);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xd);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xe);
    auVar6 = vpinsrb_avx(auVar6,0x80,0xf);
    auVar24 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar24 = vpinsrb_avx(auVar24,0x80,2);
    auVar24 = vpinsrb_avx(auVar24,0x80,3);
    auVar24 = vpinsrb_avx(auVar24,0x80,4);
    auVar24 = vpinsrb_avx(auVar24,0x80,5);
    auVar24 = vpinsrb_avx(auVar24,0x80,6);
    auVar24 = vpinsrb_avx(auVar24,0x80,7);
    auVar24 = vpinsrb_avx(auVar24,0x80,8);
    auVar24 = vpinsrb_avx(auVar24,0x80,9);
    auVar24 = vpinsrb_avx(auVar24,0x80,10);
    auVar24 = vpinsrb_avx(auVar24,0x80,0xb);
    auVar24 = vpinsrb_avx(auVar24,0x80,0xc);
    auVar24 = vpinsrb_avx(auVar24,0x80,0xd);
    auVar24 = vpinsrb_avx(auVar24,0x80,0xe);
    auVar24 = vpinsrb_avx(auVar24,0x80,0xf);
    uStack_630 = auVar24._0_8_;
    uStack_628 = auVar24._8_8_;
    local_920._16_8_ = uStack_630;
    local_920._0_16_ = auVar6;
    local_920._24_8_ = uStack_628;
    cVar1 = *(char *)(lVar2 + 0x1c);
    auVar7 = vpinsrb_avx(ZEXT116(1),0,1);
    auVar7 = vpinsrb_avx(auVar7,0,2);
    auVar7 = vpinsrb_avx(auVar7,0,3);
    auVar7 = vpinsrb_avx(auVar7,0,4);
    auVar7 = vpinsrb_avx(auVar7,0,5);
    auVar7 = vpinsrb_avx(auVar7,0,6);
    auVar7 = vpinsrb_avx(auVar7,0,7);
    auVar7 = vpinsrb_avx(auVar7,0,8);
    auVar7 = vpinsrb_avx(auVar7,0,9);
    auVar7 = vpinsrb_avx(auVar7,0,10);
    auVar7 = vpinsrb_avx(auVar7,0,0xb);
    auVar7 = vpinsrb_avx(auVar7,0,0xc);
    auVar7 = vpinsrb_avx(auVar7,0,0xd);
    auVar7 = vpinsrb_avx(auVar7,0,0xe);
    auVar7 = vpinsrb_avx(auVar7,0,0xf);
    auVar8 = vpinsrb_avx(ZEXT116(0),0,1);
    auVar8 = vpinsrb_avx(auVar8,0,2);
    auVar8 = vpinsrb_avx(auVar8,0,3);
    auVar8 = vpinsrb_avx(auVar8,0,4);
    auVar8 = vpinsrb_avx(auVar8,0,5);
    auVar8 = vpinsrb_avx(auVar8,0,6);
    auVar8 = vpinsrb_avx(auVar8,0,7);
    auVar8 = vpinsrb_avx(auVar8,0,8);
    auVar8 = vpinsrb_avx(auVar8,0,9);
    auVar8 = vpinsrb_avx(auVar8,0,10);
    auVar8 = vpinsrb_avx(auVar8,0,0xb);
    auVar8 = vpinsrb_avx(auVar8,0,0xc);
    auVar8 = vpinsrb_avx(auVar8,0,0xd);
    auVar8 = vpinsrb_avx(auVar8,0,0xe);
    auVar8 = vpinsrb_avx(auVar8,0,0xf);
    uStack_5b0 = auVar8._0_8_;
    uStack_5a8 = auVar8._8_8_;
    auVar11._16_8_ = uStack_5b0;
    auVar11._0_16_ = auVar7;
    auVar11._24_8_ = uStack_5a8;
    auVar9._16_8_ = uStack_670;
    auVar9._0_16_ = auVar23;
    auVar9._24_8_ = uStack_668;
    auVar9 = vpcmpgtb_avx2(auVar11,auVar9);
    auVar25 = ZEXT1664(auVar23);
    local_7d0 = parasail_result_new_rowcol1(iVar21 * 0x20,in_EDX);
    if (local_7d0 == (parasail_result_t *)0x0) {
      local_7d0 = (parasail_result_t *)0x0;
    }
    else {
      local_7d0->flag = local_7d0->flag | 0x20100804;
      local_7d0->flag = local_7d0->flag | 0x40000;
      local_830 = parasail_memalign___m256i(0x20,(long)iVar21);
      local_838 = parasail_memalign___m256i(0x20,(long)iVar21);
      local_840 = parasail_memalign___m256i(0x20,(long)iVar21);
      ptr = parasail_memalign___m256i(0x20,(long)iVar21);
      if (local_830 == (__m256i *)0x0) {
        local_7d0 = (parasail_result_t *)0x0;
      }
      else if (local_838 == (__m256i *)0x0) {
        local_7d0 = (parasail_result_t *)0x0;
      }
      else if (local_840 == (__m256i *)0x0) {
        local_7d0 = (parasail_result_t *)0x0;
      }
      else if (ptr == (__m256i *)0x0) {
        local_7d0 = (parasail_result_t *)0x0;
      }
      else {
        alVar12[0]._4_1_ = local_7e8;
        alVar12[0]._0_4_ = in_stack_fffffffffffff578;
        alVar12[0]._5_1_ = local_7ec;
        alVar12[0]._6_1_ = uVar26;
        alVar12[0]._7_1_ = uVar27;
        alVar12[1]._0_4_ = in_stack_fffffffffffff580;
        alVar12[1]._4_4_ = in_stack_fffffffffffff584;
        alVar12[2] = in_stack_fffffffffffff588;
        alVar12[3] = in_stack_fffffffffffff590;
        parasail_memset___m256i
                  (in_stack_fffffffffffff5b0,alVar12,
                   CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
        c[0]._4_1_ = local_7e8;
        c[0]._0_4_ = in_stack_fffffffffffff578;
        c[0]._5_1_ = local_7ec;
        c[0]._6_1_ = uVar26;
        c[0]._7_1_ = uVar27;
        c[1]._0_4_ = in_stack_fffffffffffff580;
        c[1]._4_4_ = in_stack_fffffffffffff584;
        c[2] = in_stack_fffffffffffff588;
        c[3] = in_stack_fffffffffffff590;
        parasail_memset___m256i
                  (in_stack_fffffffffffff5b0,c,
                   CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
        local_7f4 = 0;
        auVar23 = auVar6;
        while( true ) {
          palVar20 = local_830;
          palVar28 = local_840;
          uStack_928 = auVar24._8_8_;
          uStack_930 = auVar24._0_8_;
          if (in_EDX <= local_7f4) break;
          local_9e0._16_8_ = uStack_630;
          local_9e0._0_16_ = auVar6;
          local_9e0._24_8_ = uStack_628;
          auVar11 = vperm2i128_avx2(auVar25._0_32_,(undefined1  [32])local_830[iVar21 + -1],0x28);
          auVar11 = vpalignr_avx2((undefined1  [32])local_830[iVar21 + -1],auVar11,0xf);
          auVar10._16_8_ = uStack_630;
          auVar10._0_16_ = auVar6;
          auVar10._24_8_ = uStack_628;
          local_a00 = vpblendvb_avx2(auVar11,auVar10,auVar9);
          iVar22 = *(int *)(*(long *)(lVar2 + 0x10) + (ulong)*(byte *)(in_RSI + local_7f4) * 4);
          if (local_800 == local_7f4 + -2) {
            local_840 = local_838;
            local_830 = palVar28;
          }
          else {
            local_830 = local_838;
          }
          local_838 = palVar20;
          for (local_7f0 = 0; auVar25 = ZEXT3264(auVar10), local_7f0 < iVar21;
              local_7f0 = local_7f0 + 1) {
            auVar11 = vpaddsb_avx2(local_a00,
                                   *(undefined1 (*) [32])
                                    (lVar3 + (long)(iVar22 * iVar21) * 0x20 + (long)local_7f0 * 0x20
                                    ));
            alVar12 = ptr[local_7f0];
            auVar11 = vpmaxsb_avx2(auVar11,(undefined1  [32])ptr[local_7f0]);
            auVar11 = vpmaxsb_avx2(auVar11,local_9e0);
            palVar28 = local_830 + local_7f0;
            local_a00._0_8_ = auVar11._0_8_;
            local_a00._8_8_ = auVar11._8_8_;
            local_a00._16_8_ = auVar11._16_8_;
            local_a00._24_8_ = auVar11._24_8_;
            (*palVar28)[0] = local_a00._0_8_;
            (*palVar28)[1] = local_a00._8_8_;
            (*palVar28)[2] = local_a00._16_8_;
            (*palVar28)[3] = local_a00._24_8_;
            local_920 = vpmaxsb_avx2(auVar11,local_920);
            auVar19._16_8_ = uStack_6f0;
            auVar19._0_16_ = auVar4;
            auVar19._24_8_ = uStack_6e8;
            auVar10 = vpsubsb_avx2(auVar11,auVar19);
            auVar18._16_8_ = uStack_6b0;
            auVar18._0_16_ = auVar5;
            auVar18._24_8_ = uStack_6a8;
            auVar11 = vpsubsb_avx2((undefined1  [32])alVar12,auVar18);
            auVar11 = vpmaxsb_avx2(auVar11,auVar10);
            palVar28 = ptr + local_7f0;
            local_9c0 = auVar11._0_8_;
            lStack_9b8 = auVar11._8_8_;
            lStack_9b0 = auVar11._16_8_;
            lStack_9a8 = auVar11._24_8_;
            (*palVar28)[0] = local_9c0;
            (*palVar28)[1] = lStack_9b8;
            (*palVar28)[2] = lStack_9b0;
            (*palVar28)[3] = lStack_9a8;
            auVar17._16_8_ = uStack_6b0;
            auVar17._0_16_ = auVar5;
            auVar17._24_8_ = uStack_6a8;
            auVar11 = vpsubsb_avx2(local_9e0,auVar17);
            local_9e0 = vpmaxsb_avx2(auVar11,auVar10);
            local_a00 = *(undefined1 (*) [32])(palVar20 + local_7f0);
          }
          for (local_7f8 = 0; local_7f8 < 0x20; local_7f8 = local_7f8 + 1) {
            auVar11 = vperm2i128_avx2(auVar25._0_32_,local_9e0,0x28);
            auVar11 = vpalignr_avx2(local_9e0,auVar11,0xf);
            auVar14._16_8_ = uStack_630;
            auVar14._0_16_ = auVar6;
            auVar14._24_8_ = uStack_628;
            auVar25 = ZEXT3264(auVar14);
            local_9e0 = vpblendvb_avx2(auVar11,auVar14,auVar9);
            for (local_7f0 = 0; local_7f0 < iVar21; local_7f0 = local_7f0 + 1) {
              auVar11 = vpmaxsb_avx2((undefined1  [32])local_830[local_7f0],local_9e0);
              palVar28 = local_830 + local_7f0;
              local_a00._0_8_ = auVar11._0_8_;
              local_a00._8_8_ = auVar11._8_8_;
              local_a00._16_8_ = auVar11._16_8_;
              local_a00._24_8_ = auVar11._24_8_;
              (*palVar28)[0] = local_a00._0_8_;
              (*palVar28)[1] = local_a00._8_8_;
              (*palVar28)[2] = local_a00._16_8_;
              (*palVar28)[3] = local_a00._24_8_;
              local_920 = vpmaxsb_avx2(auVar11,local_920);
              auVar16._16_8_ = uStack_6f0;
              auVar16._0_16_ = auVar4;
              auVar16._24_8_ = uStack_6e8;
              auVar11 = vpsubsb_avx2(auVar11,auVar16);
              auVar15._16_8_ = uStack_6b0;
              auVar15._0_16_ = auVar5;
              auVar15._24_8_ = uStack_6a8;
              local_9e0 = vpsubsb_avx2(local_9e0,auVar15);
              auVar25 = ZEXT3264(auVar11);
              auVar11 = vpcmpgtb_avx2(local_9e0,auVar11);
              if ((((((((((((((((((((((((((((((((auVar11 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar11 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar11 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar11 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar11 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar11 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar11 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar11 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar11 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar11 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar11 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar11 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar11 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar11 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar11 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar11 >> 0x7f,0) == '\0') &&
                                (auVar11 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar11 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar11 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar11 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar11 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar11 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar11 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar11 >> 0xbf,0) == '\0') &&
                        (auVar11 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar11 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar11 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar11 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar11 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar11 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar11 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar11[0x1f]) goto LAB_00e24f1c;
            }
          }
LAB_00e24f1c:
          local_a00 = *(undefined1 (*) [32])(local_830 + (local_7fc + -1) % iVar21);
          for (local_7f8 = 0; local_7f8 < (int)(~((local_7fc + -1) / iVar21) + 0x20U);
              local_7f8 = local_7f8 + 1) {
            auVar11 = vperm2i128_avx2(auVar25._0_32_,local_a00,0x28);
            auVar25 = ZEXT3264(auVar11);
            local_a00 = vpalignr_avx2(local_a00,auVar11,0xf);
          }
          ((local_7d0->field_4).rowcols)->score_row[local_7f4] = local_a00[0x1f] + 0x80;
          auVar13._16_8_ = uStack_930;
          auVar13._0_16_ = auVar23;
          auVar13._24_8_ = uStack_928;
          auVar25 = ZEXT3264(auVar13);
          auVar11 = vpcmpgtb_avx2(local_920,auVar13);
          lStack_a28 = auVar11._24_8_;
          if ((((((((((((((((((((((((((((((((auVar11 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar11 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar11 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar11 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar11 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar11 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar11 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar11 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar11 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar11 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar11 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar11 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar11 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar11 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar11 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar11 >> 0x7f,0) != '\0') ||
                            (auVar11 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar11 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar11 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar11 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar11 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar11 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar11 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar11 >> 0xbf,0) != '\0') ||
                    (auVar11 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar11 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar11 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar11 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar11 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar11 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_a28 < 0)
          {
            a._8_12_ = in_stack_fffffffffffff560;
            a[0] = 0xe2503b;
            a[2]._4_4_ = in_stack_fffffffffffff56c;
            a[3]._0_4_ = in_stack_fffffffffffff570;
            a[3]._4_4_ = in_stack_fffffffffffff574;
            local_8c2 = _mm256_hmax_epi8_rpl(a);
            if ((char)(cVar1 + 1U ^ 0x7f) < (char)local_8c2) {
              local_7d0->flag = local_7d0->flag | 0x40;
              break;
            }
            in_stack_fffffffffffff578 = CONCAT13(local_8c2,(int3)in_stack_fffffffffffff578);
            auVar23 = vpinsrb_avx(ZEXT116(local_8c2),(uint)local_8c2,1);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,2);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,3);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,4);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,5);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,6);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,7);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,8);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,9);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,10);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,0xb);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,0xc);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,0xd);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,0xe);
            auVar24 = vpinsrb_avx(auVar23,(uint)local_8c2,0xf);
            auVar25 = ZEXT1664(auVar24);
            auVar23 = vpinsrb_avx(ZEXT116(local_8c2),(uint)local_8c2,1);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,2);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,3);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,4);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,5);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,6);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,7);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,8);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,9);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,10);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,0xb);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,0xc);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,0xd);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,0xe);
            auVar23 = vpinsrb_avx(auVar23,(uint)local_8c2,0xf);
            auVar23 = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar23;
            auVar24 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
            local_800 = local_7f4;
          }
          local_7f4 = local_7f4 + 1;
        }
        palVar28 = local_840;
        for (local_7f0 = 0; local_7f0 < iVar21; local_7f0 = local_7f0 + 1) {
          vH_00[0]._4_1_ = local_7e8;
          vH_00[0]._0_4_ = in_stack_fffffffffffff578;
          vH_00[0]._5_1_ = local_7ec;
          vH_00[0]._6_1_ = uVar26;
          vH_00[0]._7_1_ = uVar27;
          vH_00[1]._0_4_ = in_stack_fffffffffffff580;
          vH_00[1]._4_4_ = in_stack_fffffffffffff584;
          vH_00[2] = in_stack_fffffffffffff588;
          vH_00[3] = in_stack_fffffffffffff590;
          arr_store_col((int *)local_830[local_7f0][0],vH_00,in_stack_fffffffffffff574,
                        in_stack_fffffffffffff570,in_stack_fffffffffffff56c);
        }
        if (local_8c2 == 0x7f) {
          local_7d0->flag = local_7d0->flag | 0x40;
        }
        iVar22 = parasail_result_is_saturated(local_7d0);
        if (iVar22 == 0) {
          if (local_800 == local_7f4 + -1) {
            local_840 = local_830;
            local_830 = palVar28;
          }
          else if (local_800 == local_7f4 + -2) {
            local_840 = local_838;
            local_838 = palVar28;
          }
          local_7fc = local_7fc + -1;
          palVar28 = local_840;
          for (local_7f0 = 0; local_7f0 < iVar21 * 0x20; local_7f0 = local_7f0 + 1) {
            if (((byte)(*palVar28)[0] == local_8c2) &&
               (iVar22 = local_7f0 / 0x20 + (local_7f0 % 0x20) * iVar21, iVar22 < local_7fc)) {
              local_7fc = iVar22;
            }
            palVar28 = (__m256i *)((long)*palVar28 + 1);
          }
        }
        else {
          local_8c2 = 0x7f;
          local_7fc = 0;
          local_800 = 0;
        }
        local_7d0->score = (char)local_8c2 + 0x80;
        local_7d0->end_query = local_7fc;
        local_7d0->end_ref = local_800;
        parasail_free(ptr);
        parasail_free(local_840);
        parasail_free(local_838);
        parasail_free(local_830);
      }
    }
  }
  return local_7d0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int8_t bias = 0;
    int8_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int8_t maxp = 0;
    __m256i insert_mask;
    /*int8_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    vZero = _mm256_set1_epi8(0);
    bias = INT8_MIN;
    score = bias;
    vBias = _mm256_set1_epi8(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT8_MAX - (int8_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi8(
            _mm256_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT8_MAX : (int8_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi8(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi8(vH, vMaxH);
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi8(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT8_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}